

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::InitMaterialData
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,TPZMaterialData *data)

{
  int iVar1;
  long in_RSI;
  TPZManVector<long,_6> *in_RDI;
  TPZFNMatrix<20,_double> *curlphi;
  TPZFNMatrix<20,_double> *phi;
  TPZMaterialData *in_stack_00000058;
  int nshape;
  int curldim;
  int dim;
  int i_1;
  int64_t nConnects;
  TPZManVector<int,_27> *conOrders;
  int i;
  TPZGeoEl *ref;
  TPZManVector<long,_6> ids;
  TPZShapeData *shapedata;
  TPZShapeData *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  TPZGeoEl *in_stack_ffffffffffffff10;
  long *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  TPZFMatrix<double> *in_stack_ffffffffffffff28;
  int local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  TPZVec<int> *local_90;
  int local_88;
  TPZGeoEl *local_78;
  undefined8 local_70;
  TPZVec<long> local_68 [2];
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  TPZInterpolationSpace::InitMaterialData(_curldim,in_stack_00000058);
  *(undefined4 *)(local_10 + 8) = 3;
  local_18 = local_10;
  local_70 = 0;
  TPZManVector<long,_6>::TPZManVector
            (in_RDI,(int64_t)in_stack_ffffffffffffff28,
             (long *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_78 = TPZCompEl::Reference
                       ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  for (local_88 = 0; local_88 < 6; local_88 = local_88 + 1) {
    in_stack_ffffffffffffff28 =
         (TPZFMatrix<double> *)
         TPZGeoEl::NodePtr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    in_stack_ffffffffffffff24 = TPZGeoNode::Id((TPZGeoNode *)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff10 = (TPZGeoEl *)(long)in_stack_ffffffffffffff24;
    in_stack_ffffffffffffff18 = TPZVec<long>::operator[](local_68,(long)local_88);
    *in_stack_ffffffffffffff18 = (long)in_stack_ffffffffffffff10;
  }
  local_90 = (TPZVec<int> *)(local_18 + 0x2b50);
  local_98 = 0xf;
  local_9c = 0xffffffff;
  (*local_90->_vptr_TPZVec[2])(local_90,0xf,&local_9c);
  for (local_a0 = 0; local_a0 < 0xf; local_a0 = local_a0 + 1) {
    in_stack_ffffffffffffff0c =
         (*(in_RDI->super_TPZVec<long>)._vptr_TPZVec[0x67])(in_RDI,(ulong)(local_a0 + 6));
    in_stack_ffffffffffffff00 = (TPZShapeData *)TPZVec<int>::operator[](local_90,(long)local_a0);
    *(int *)in_stack_ffffffffffffff00 = in_stack_ffffffffffffff0c;
  }
  iVar1 = (int)in_RDI[3].super_TPZVec<long>.fNAlloc;
  if (iVar1 == 0) {
    TPZShapeHCurl<pzshape::TPZShapePrism>::Initialize
              ((TPZVec<long> *)ids.fExtAlloc[2],(TPZVec<int> *)ids.fExtAlloc[1],
               (TPZShapeData *)ids.fExtAlloc[0]);
  }
  else if (iVar1 == 1) {
    TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize
              ((TPZVec<long> *)in_stack_ffffffffffffff10,
               (TPZVec<int> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
  }
  iVar1 = (*(in_RDI->super_TPZVec<long>)._vptr_TPZVec[0x4b])();
  (**(code **)(*(long *)(local_10 + 0x3900) + 0x70))((long *)(local_10 + 0x3900),(long)iVar1,3);
  (**(code **)(*(long *)(local_10 + 0x3de8) + 0x70))((long *)(local_10 + 0x3de8),3,(long)iVar1);
  TPZFMatrix<double>::Redim
            (in_stack_ffffffffffffff28,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
             ,(int64_t)in_stack_ffffffffffffff18);
  TPZFMatrix<double>::Redim
            (in_stack_ffffffffffffff28,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
             ,(int64_t)in_stack_ffffffffffffff18);
  TPZFMatrix<double>::Redim
            (in_stack_ffffffffffffff28,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
             ,(int64_t)in_stack_ffffffffffffff18);
  TPZManVector<double,_3>::Resize
            ((TPZManVector<double,_3> *)in_RDI,(int64_t)in_stack_ffffffffffffff28);
  TPZManVector<long,_6>::~TPZManVector((TPZManVector<long,_6> *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::InitMaterialData(TPZMaterialData &data){
	TPZIntelGen<TSHAPE>::InitMaterialData(data);
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHCurl")
    }
#endif
    data.fShapeType = TPZMaterialData::MShapeFunctionType::EVecShape;
    TPZShapeData & shapedata = data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    auto &conOrders = shapedata.fHDivConnectOrders;
    constexpr auto nConnects = TSHAPE::NSides - TSHAPE::NCornerNodes;
    conOrders.Resize(nConnects,-1);
    for(auto i = 0; i < nConnects; i++){
        conOrders[i] = this->EffectiveSideOrder(i + TSHAPE::NCornerNodes);
    }

    switch (fhcurlfam)
    {
    case HCurlFamily::EHCurlStandard:
        TPZShapeHCurl<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    case HCurlFamily::EHCurlNoGrads:
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    }/**there is no default case on purpose, because now the compiler
      will warn us if a new hcurl family is added*/
    

    //resizing of TPZMaterialData structures

    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nshape = this->NShapeF();
    
    auto &phi = data.phi;
    auto &curlphi = data.curlphi;
    
    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
// #ifdef PZ_LOG
//     if(logger.isDebugEnabled()){
// 		std::stringstream sout;
// 		sout << "Vector/Shape indexes \n";
//         for (int i = 0; i < shapedata.fVecShapeIndex.size(); i++) {
//             sout << i << '|' << shapedata.fVecShapeIndex[i] << " ";
//         }
//         sout << std::endl;
// 		LOGPZ_DEBUG(logger,sout.str())
// 	}
// #endif

}